

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsstyle.cpp
# Opt level: O2

bool __thiscall QWindowsStyle::eventFilter(QWindowsStyle *this,QObject *o,QEvent *e)

{
  short sVar1;
  QWidget **ppQVar2;
  undefined1 uVar3;
  int iVar4;
  QWidget *pQVar5;
  QStyle *pQVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<QWidget_*> local_58;
  QWidget *widget;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(*(long *)(o + 8) + 0x30) & 1) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      uVar3 = QObject::eventFilter((QObject *)this,(QEvent *)o);
      return (bool)uVar3;
    }
  }
  else {
    lVar7 = *(long *)&(this->super_QCommonStyle).super_QStyle.field_0x8;
    sVar1 = *(short *)(e + 8);
    widget = (QWidget *)o;
    if (sVar1 == 0x13) {
      QtPrivate::sequential_erase_with_copy<QList<QWidget_const*>,QWidget*>
                ((QList<const_QWidget_*> *)(lVar7 + 0xf0),&widget);
      local_58.d = (Data *)QWidget::window(widget);
      QtPrivate::sequential_erase_with_copy<QList<QWidget_const*>,QWidget*>
                ((QList<const_QWidget_*> *)(lVar7 + 0xf0),(QWidget **)&local_58);
    }
    else if (sVar1 == 7) {
      if (*(int *)(e + 0x40) == 0x1000023) {
        widget = QWidget::window((QWidget *)o);
        *(undefined1 *)(lVar7 + 0xe8) = 0;
        local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
        QObject::findChildren<QMenuBar*>
                  ((QList<QMenuBar_*> *)&local_58,&widget->super_QObject,(FindChildOptions)0x1);
        ppQVar2 = local_58.ptr;
        lVar7 = local_58.size << 3;
        for (lVar8 = 0; lVar7 != lVar8; lVar8 = lVar8 + 8) {
          QWidget::update(*(QWidget **)((long)ppQVar2 + lVar8));
        }
        QArrayDataPointer<QMenuBar_*>::~QArrayDataPointer
                  ((QArrayDataPointer<QMenuBar_*> *)&local_58);
      }
    }
    else if ((sVar1 == 6) && (*(int *)(e + 0x40) == 0x1000023)) {
      pQVar5 = QWidget::window((QWidget *)o);
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      widget = pQVar5;
      QObject::findChildren<QWidget*>
                ((QList<QWidget_*> *)&local_58,&pQVar5->super_QObject,(FindChildOptions)0x1);
      QList<const_QWidget_*>::append((QList<const_QWidget_*> *)(lVar7 + 0xf0),pQVar5);
      ppQVar2 = local_58.ptr;
      *(undefined1 *)(lVar7 + 0xe8) = 1;
      lVar7 = local_58.size << 3;
      for (lVar8 = 0; lVar7 != lVar8; lVar8 = lVar8 + 8) {
        pQVar5 = *(QWidget **)((long)ppQVar2 + lVar8);
        if ((((pQVar5->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) &&
           ((pQVar5->data->widget_attributes & 0x8000) != 0)) {
          pQVar6 = QWidget::style(pQVar5);
          iVar4 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x29,0,pQVar5,0);
          if (iVar4 == 0) {
            QWidget::update(pQVar5);
          }
        }
      }
      QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_58);
    }
    uVar3 = QObject::eventFilter((QObject *)this,(QEvent *)o);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (bool)uVar3;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool QWindowsStyle::eventFilter(QObject *o, QEvent *e)
{
    // Records Alt- and Focus events
    if (!o->isWidgetType())
        return QObject::eventFilter(o, e);

    QWidget *widget = qobject_cast<QWidget*>(o);
    Q_D(QWindowsStyle);
    switch(e->type()) {
    case QEvent::KeyPress:
        if (static_cast<QKeyEvent *>(e)->key() == Qt::Key_Alt) {
            widget = widget->window();

            // Alt has been pressed - find all widgets that care
            const QList<QWidget *> children = widget->findChildren<QWidget *>();
            auto ignorable = [](QWidget *w) {
                return w->isWindow() || !w->isVisible()
                        || w->style()->styleHint(SH_UnderlineShortcut, nullptr, w);
            };
            // Update states before repainting
            d->seenAlt.append(widget);
            d->alt_down = true;

            // Repaint all relevant widgets
            for (QWidget *w : children) {
                if (!ignorable(w))
                    w->update();
            }
        }
        break;
    case QEvent::KeyRelease:
        if (static_cast<QKeyEvent*>(e)->key() == Qt::Key_Alt) {
            widget = widget->window();

            // Update state and repaint the menu bars.
            d->alt_down = false;
#if QT_CONFIG(menubar)
            const QList<QMenuBar *> menuBars = widget->findChildren<QMenuBar *>();
            for (QWidget *w : menuBars)
                w->update();
#endif
        }
        break;
    case QEvent::Close:
        // Reset widget when closing
        d->seenAlt.removeAll(widget);
        d->seenAlt.removeAll(widget->window());
        break;
    default:
        break;
    }
    return QCommonStyle::eventFilter(o, e);
}